

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O2

read_critical_section __thiscall unodb::optimistic_lock::try_read_lock(optimistic_lock *this)

{
  ulong uVar1;
  version_type in_RDX;
  ulong *in_RSI;
  read_critical_section rVar2;
  
  do {
    uVar1 = *in_RSI;
    if ((uVar1 & 3) == 0) {
      LOCK();
      in_RSI[1] = in_RSI[1] + 1;
      UNLOCK();
      (this->version).version.super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)in_RSI;
      (this->read_lock_count).super___atomic_base<long>._M_i = uVar1;
LAB_0011609e:
      rVar2.version.version = in_RDX.version;
      rVar2.lock = this;
      return rVar2;
    }
    if (uVar1 == 1) {
      (this->version).version.super___atomic_base<unsigned_long>._M_i = 0;
      (this->read_lock_count).super___atomic_base<long>._M_i = 0;
      goto LAB_0011609e;
    }
    if ((uVar1 & 2) == 0) {
      __assert_fail("current_version.is_write_locked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2b7,"read_critical_section unodb::optimistic_lock::try_read_lock()");
    }
  } while( true );
}

Assistant:

[[nodiscard]] read_critical_section try_read_lock() noexcept {
    while (true) {
      const auto current_version = version.load_acquire();
      if (UNODB_DETAIL_LIKELY(current_version.is_free())) {
        inc_read_lock_count();
        return read_critical_section{*this, current_version};
      }
      // LCOV_EXCL_START
      if (UNODB_DETAIL_UNLIKELY(current_version.is_obsolete()))
        return read_critical_section{};
      UNODB_DETAIL_ASSERT(current_version.is_write_locked());
      spin_wait_loop_body();
      // LCOV_EXCL_STOP
    }
  }